

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O1

void commit_x4(uint8_t **digest,uint8_t **seed,uint8_t *salt,size_t t,size_t j,
              picnic_instance_t *params)

{
  uint capacity;
  uint rate;
  uint16_t data3_le;
  uint16_t data2_le;
  uint16_t data1_le;
  uint16_t data_le;
  hash_context_x4 ctx;
  short local_398;
  short local_396;
  short local_394;
  short local_392;
  uint8_t **local_390;
  undefined1 local_388 [16];
  short *psStack_378;
  short *psStack_370;
  Keccak_HashInstancetimes4 local_368;
  
  if (params->digest_size == ' ') {
    rate = 0x540;
    capacity = 0x100;
  }
  else {
    rate = 0x440;
    capacity = 0x200;
  }
  local_390 = digest;
  Keccak_HashInitializetimes4(&local_368,rate,capacity,0,'\x1f');
  Keccak_HashUpdatetimes4(&local_368,seed,(ulong)params->seed_size << 3);
  _local_388 = vpbroadcastq_avx512vl();
  Keccak_HashUpdatetimes4(&local_368,(BitSequence **)local_388,0x100);
  local_392 = (short)t;
  _local_388 = vpbroadcastq_avx512vl();
  Keccak_HashUpdatetimes4(&local_368,(BitSequence **)local_388,0x10);
  local_392 = (short)j;
  local_394 = local_392 + 1;
  local_396 = local_392 + 2;
  local_398 = local_392 + 3;
  local_388._8_8_ = &local_394;
  local_388._0_8_ = &local_392;
  psStack_378 = &local_396;
  psStack_370 = &local_398;
  Keccak_HashUpdatetimes4(&local_368,(BitSequence **)local_388,0x10);
  Keccak_HashFinaltimes4(&local_368,(BitSequence **)0x0);
  Keccak_HashSqueezetimes4(&local_368,local_390,(ulong)params->digest_size << 3);
  return;
}

Assistant:

static void commit_x4(uint8_t** digest, const uint8_t** seed, const uint8_t* salt, size_t t,
                      size_t j, const picnic_instance_t* params) {
  /* Compute C[t][j];  as digest = H(seed||[aux]) aux is optional */
  hash_context_x4 ctx;

  hash_init_x4(&ctx, params->digest_size);
  hash_update_x4(&ctx, seed, params->seed_size);
  hash_update_x4_1(&ctx, salt, SALT_SIZE);
  hash_update_x4_uint16_le(&ctx, t);
  const uint16_t j_arr[4] = {j + 0, j + 1, j + 2, j + 3};
  hash_update_x4_uint16s_le(&ctx, j_arr);
  hash_final_x4(&ctx);
  hash_squeeze_x4(&ctx, digest, params->digest_size);
  hash_clear_x4(&ctx);
}